

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice_p.h
# Opt level: O3

void __thiscall QInputDevicePrivate::setAvailableVirtualGeometry(QInputDevicePrivate *this,QRect a)

{
  uint uVar1;
  undefined8 uVar2;
  QRect QVar3;
  
  uVar2 = a._0_8_;
  if ((((*(int *)(this + 0xc0) == a.x1.m_i.m_i) && (*(int *)(this + 200) == a.x2.m_i.m_i)) &&
      (*(int *)(this + 0xc4) == a.y1.m_i.m_i)) && (*(int *)(this + 0xcc) == a.y2.m_i.m_i)) {
    return;
  }
  *(undefined8 *)(this + 0xc0) = uVar2;
  *(long *)(this + 200) = a._8_8_;
  uVar1 = *(uint *)(this + 0xe0) | 0x20;
  if (*(uint *)(this + 0xe0) != uVar1) {
    *(uint *)(this + 0xe0) = uVar1;
    QInputDevice::capabilitiesChanged(*(undefined8 *)(this + 8),uVar1);
    uVar2 = *(undefined8 *)(this + 0xc0);
  }
  QVar3.x2.m_i = (int)uVar2;
  QVar3.y2.m_i = (int)((ulong)uVar2 >> 0x20);
  QVar3._0_8_ = *(undefined8 *)(this + 8);
  QInputDevice::availableVirtualGeometryChanged(QVar3);
  return;
}

Assistant:

void setAvailableVirtualGeometry(QRect a)
    {
        if (a == availableVirtualGeometry)
            return;

        availableVirtualGeometry = a;
        setCapabilities(capabilities | QInputDevice::Capability::NormalizedPosition);
        Q_Q(QInputDevice);
        Q_EMIT q->availableVirtualGeometryChanged(availableVirtualGeometry);
    }